

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# dxil_workgraph.cpp
# Opt level: O0

uint32_t dxil_spv::get_node_meta_index_from_annotate_handle(CallInst *inst)

{
  bool bVar1;
  Value *value;
  uint32_t local_14;
  CallInst *pCStack_10;
  uint32_t meta_index;
  CallInst *inst_local;
  
  pCStack_10 = inst;
  while (bVar1 = value_is_dx_op_instrinsic((Value *)pCStack_10,CreateNodeOutputHandle),
        ((bVar1 ^ 0xffU) & 1) != 0) {
    bVar1 = value_is_dx_op_instrinsic((Value *)pCStack_10,AnnotateNodeRecordHandle);
    if ((((bVar1) ||
         (bVar1 = value_is_dx_op_instrinsic((Value *)pCStack_10,AnnotateNodeHandle), bVar1)) ||
        (bVar1 = value_is_dx_op_instrinsic((Value *)pCStack_10,IndexNodeHandle), bVar1)) ||
       (bVar1 = value_is_dx_op_instrinsic((Value *)pCStack_10,AllocateNodeOutputRecords), bVar1)) {
      value = LLVMBC::Instruction::getOperand(&pCStack_10->super_Instruction,1);
      pCStack_10 = LLVMBC::cast<LLVMBC::CallInst>(value);
    }
  }
  local_14 = 0xffffffff;
  bVar1 = value_is_dx_op_instrinsic((Value *)pCStack_10,CreateNodeOutputHandle);
  if (bVar1) {
    get_constant_operand(&pCStack_10->super_Instruction,1,&local_14);
  }
  return local_14;
}

Assistant:

static uint32_t get_node_meta_index_from_annotate_handle(const llvm::CallInst *inst)
{
	// Crawl through the SSA noise until we find CreateNodeOutputHandle.
	while (!value_is_dx_op_instrinsic(inst, DXIL::Op::CreateNodeOutputHandle))
	{
		if (value_is_dx_op_instrinsic(inst, DXIL::Op::AnnotateNodeRecordHandle) ||
		    value_is_dx_op_instrinsic(inst, DXIL::Op::AnnotateNodeHandle) ||
		    value_is_dx_op_instrinsic(inst, DXIL::Op::IndexNodeHandle) ||
		    value_is_dx_op_instrinsic(inst, DXIL::Op::AllocateNodeOutputRecords))
		{
			inst = llvm::cast<llvm::CallInst>(inst->getOperand(1));
		}
	}

	uint32_t meta_index = UINT32_MAX;
	if (value_is_dx_op_instrinsic(inst, DXIL::Op::CreateNodeOutputHandle))
		get_constant_operand(inst, 1, &meta_index);

	return meta_index;
}